

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitops.hpp
# Opt level: O2

uint reference_ceillog2(uint x)

{
  int iVar1;
  uint uVar2;
  uint n;
  
  iVar1 = 0;
  for (uVar2 = x; uVar2 != 0; uVar2 = uVar2 >> 1) {
    iVar1 = iVar1 + 1;
  }
  return iVar1 - (uint)((x - 1 & x) == 0);
}

Assistant:

unsigned int reference_ceillog2(unsigned int x) {
    unsigned int log_floor = 0;
    unsigned int n = x;
    for (;n != 0; n >>= 1)
    {
        ++log_floor;
    }
    --log_floor;
    // add one if not power of 2
    return log_floor + (((x&(x-1)) != 0) ? 1 : 0);
}